

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O1

EStatusCode __thiscall CFFPrimitiveReader::Read4ByteSigned(CFFPrimitiveReader *this,long *outValue)

{
  EStatusCode EVar1;
  EStatusCode EVar2;
  unsigned_long buffer;
  int local_10 [2];
  
  EVar1 = Read4ByteUnsigned(this,(unsigned_long *)local_10);
  EVar2 = eFailure;
  if (EVar1 == eSuccess) {
    *outValue = (long)local_10[0];
    EVar2 = eSuccess;
  }
  return EVar2;
}

Assistant:

EStatusCode CFFPrimitiveReader::Read4ByteSigned(long& outValue)
{
	unsigned long buffer;
	EStatusCode status = Read4ByteUnsigned(buffer);

	if(status != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	outValue = (int)buffer; // very important to cast to 32, to get the sign right

	return PDFHummus::eSuccess;
}